

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArrayBulkMemoryOp(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  Builder *builder;
  uintptr_t uVar1;
  bool bVar2;
  char cVar3;
  value_type *pvVar4;
  Expression *index;
  Expression *ref;
  Expression *pEVar5;
  Expression *pEVar6;
  ArrayFill *pAVar7;
  Expression *length;
  ArrayCopy *pAVar8;
  If *pIVar9;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  undefined1 local_a0 [8];
  BoundsCheck srcCheck;
  BoundsCheck check;
  value_type arrayType;
  HeapType local_50;
  value_type srcArrayType;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x13d7,"Expression *wasm::TranslateToFuzzReader::makeArrayBulkMemoryOp(Type)");
  }
  if ((this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &this->random;
    pvVar4 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this_00,&this->mutableArrays);
    local_50.id = pvVar4->id;
    wasm::HeapType::getArray();
    pEVar5 = srcCheck.getLength;
    index = make(this,(Type)0x2);
    ref = makeTrappingRefUse(this,local_50);
    bVar2 = Random::oneIn(this_00,2);
    if (bVar2) {
      pEVar5 = make(this,(Type)pEVar5);
      pEVar6 = make(this,(Type)0x2);
      if ((this->allowOOB == true) && (bVar2 = Random::oneIn(this_00,10), bVar2)) {
        pAVar7 = Builder::makeArrayFill(&this->builder,ref,index,pEVar5,pEVar6);
        return (Expression *)pAVar7;
      }
      makeArrayBoundsCheck
                ((BoundsCheck *)&srcCheck.getLength,ref,index,this->funcContext->func,&this->builder
                 ,pEVar6);
      pAVar7 = Builder::makeArrayFill
                         (&this->builder,
                          (Expression *)CONCAT44(check.condition._4_4_,check.condition._0_4_),
                          check.getRef,pEVar5,check.getIndex);
    }
    else {
      pvVar4 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this_00,&this->mutableArrays);
      uVar1 = pvVar4->id;
      wasm::HeapType::getArray();
      cVar3 = wasm::Type::isSubType((Type)srcCheck.getLength,(Type)pEVar5);
      if (cVar3 != '\0') {
        local_50.id = uVar1;
      }
      pEVar5 = make(this,(Type)0x2);
      pEVar6 = makeTrappingRefUse(this,local_50);
      length = make(this,(Type)0x2);
      if ((this->allowOOB == true) && (bVar2 = Random::oneIn(this_00,10), bVar2)) {
        pAVar8 = Builder::makeArrayCopy(&this->builder,ref,index,pEVar6,pEVar5,length);
        return (Expression *)pAVar8;
      }
      builder = &this->builder;
      makeArrayBoundsCheck
                ((BoundsCheck *)&srcCheck.getLength,ref,index,this->funcContext->func,builder,length
                );
      makeArrayBoundsCheck
                ((BoundsCheck *)local_a0,pEVar6,pEVar5,this->funcContext->func,builder,
                 check.getIndex);
      pAVar8 = Builder::makeArrayCopy
                         (builder,(Expression *)
                                  CONCAT44(check.condition._4_4_,check.condition._0_4_),check.getRef
                          ,srcCheck.condition,srcCheck.getRef,srcCheck.getIndex);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)srcCheck.getRef;
      pAVar7 = (ArrayFill *)
               Builder::makeIf(builder,(Expression *)local_a0,(Expression *)pAVar8,(Expression *)0x0
                               ,type_00);
      check.getIndex = srcCheck.getRef;
    }
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)check.getIndex
    ;
    pIVar9 = Builder::makeIf(&this->builder,srcCheck.getLength,(Expression *)pAVar7,
                             (Expression *)0x0,type_01);
    return (Expression *)pIVar9;
  }
  pEVar5 = makeTrivial(this,(Type)0x0);
  return pEVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeArrayBulkMemoryOp(Type type) {
  assert(type == Type::none);
  if (mutableArrays.empty()) {
    return makeTrivial(type);
  }
  auto arrayType = pick(mutableArrays);
  auto element = arrayType.getArray().element;
  auto* index = make(Type::i32);
  auto* ref = makeTrappingRefUse(arrayType);
  if (oneIn(2)) {
    // ArrayFill
    auto* value = make(element.type);
    auto* length = make(Type::i32);
    // Only rarely emit a plain get which might trap. See related logic in
    // ::makePointer().
    if (allowOOB && oneIn(10)) {
      return builder.makeArrayFill(ref, index, value, length);
    }
    auto check =
      makeArrayBoundsCheck(ref, index, funcContext->func, builder, length);
    auto* fill = builder.makeArrayFill(
      check.getRef, check.getIndex, value, check.getLength);
    return builder.makeIf(check.condition, fill);
  } else {
    // ArrayCopy. Here we must pick a source array whose element type is a
    // subtype of the destination.
    auto srcArrayType = pick(mutableArrays);
    auto srcElement = srcArrayType.getArray().element;
    if (!Type::isSubType(srcElement.type, element.type) ||
        element.packedType != srcElement.packedType) {
      // TODO: A matrix of which arrays are subtypes of others. For now, if we
      // didn't get what we want randomly, just copy from the same type to
      // itself.
      srcArrayType = arrayType;
      srcElement = element;
    }
    auto* srcIndex = make(Type::i32);
    auto* srcRef = makeTrappingRefUse(srcArrayType);
    auto* length = make(Type::i32);
    if (allowOOB && oneIn(10)) {
      return builder.makeArrayCopy(ref, index, srcRef, srcIndex, length);
    }
    auto check =
      makeArrayBoundsCheck(ref, index, funcContext->func, builder, length);
    auto srcCheck = makeArrayBoundsCheck(
      srcRef, srcIndex, funcContext->func, builder, check.getLength);
    auto* copy = builder.makeArrayCopy(check.getRef,
                                       check.getIndex,
                                       srcCheck.getRef,
                                       srcCheck.getIndex,
                                       srcCheck.getLength);
    return builder.makeIf(check.condition,
                          builder.makeIf(srcCheck.condition, copy));
  }
}